

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_builder.hpp
# Opt level: O3

kd_tree_data_type * __thiscall
pico_tree::internal::
build_kd_tree<pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,double>,2ul>,2ul>
::operator()(kd_tree_data_type *__return_storage_ptr__,void *this,
            space_wrapper<pico_tree::space_map<pico_tree::point_map<double,_2UL>_>_> space,
            splitter_stop_condition_t<pico_tree::max_leaf_size_t> *stop_condition,
            splitter_start_bounds_t<pico_tree::bounds_from_space_t> *start_bounds,
            splitter_rule_t<pico_tree::sliding_midpoint_max_side_t> *param_4)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  node_type *pnVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar8;
  undefined1 auVar7 [16];
  int iVar9;
  int iVar12;
  undefined1 auVar11 [16];
  box_type root_box;
  box_type box;
  vector<int,_std::allocator<int>_> local_d8;
  space_type *local_b8;
  undefined **local_b0;
  node *local_a8;
  size_t local_a0;
  chunk *pcStack_98;
  double local_90;
  double dStack_88;
  double local_80;
  double dStack_78;
  space_type **local_70;
  undefined4 local_68;
  space_type *local_60;
  undefined1 *local_58;
  undefined ***local_50;
  box_type local_48;
  undefined1 auVar10 [16];
  
  local_b8 = space.space_;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_d8,((space.space_)->storage_).size,(allocator_type *)&local_70);
  auVar3 = _DAT_00104090;
  auVar2 = _DAT_00104080;
  auVar1 = _DAT_00104010;
  if (local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar5 = (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish +
            (-4 - (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
    auVar11._8_4_ = (int)uVar5;
    auVar11._0_8_ = uVar5;
    auVar11._12_4_ = (int)(uVar5 >> 0x20);
    auVar7._0_8_ = uVar5 >> 2;
    auVar7._8_8_ = auVar11._8_8_ >> 2;
    uVar6 = 0;
    auVar7 = auVar7 ^ _DAT_00104090;
    do {
      iVar9 = (int)uVar6;
      auVar10._8_4_ = iVar9;
      auVar10._0_8_ = uVar6;
      auVar10._12_4_ = (int)(uVar6 >> 0x20);
      auVar11 = (auVar10 | auVar1) ^ auVar3;
      iVar8 = auVar7._4_4_;
      if ((bool)(~(auVar11._4_4_ == iVar8 && auVar7._0_4_ < auVar11._0_4_ || iVar8 < auVar11._4_4_)
                & 1)) {
        local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar6] = iVar9;
      }
      if ((auVar11._12_4_ != auVar7._12_4_ || auVar11._8_4_ <= auVar7._8_4_) &&
          auVar11._12_4_ <= auVar7._12_4_) {
        local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar6 + 1] = iVar9 + 1;
      }
      auVar11 = (auVar10 | auVar2) ^ auVar3;
      iVar12 = auVar11._4_4_;
      if (iVar12 <= iVar8 && (iVar12 != iVar8 || auVar11._0_4_ <= auVar7._0_4_)) {
        local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar6 + 2] = iVar9 + 2;
        local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar6 + 3] = iVar9 + 3;
      }
      uVar6 = uVar6 + 4;
    } while (((uVar5 >> 2) + 4 & 0xfffffffffffffffc) != uVar6);
  }
  box_from_bounds<pico_tree::internal::space_wrapper<pico_tree::space_map<std::array<double,2ul>>>>
            (&local_90,this,space.space_);
  local_50 = &local_b0;
  local_b0 = &PTR__list_pool_resource_00106d98;
  local_a8 = (node *)0x0;
  local_a0 = 0x100;
  local_68 = *(undefined4 *)stop_condition;
  local_70 = &local_b8;
  local_48.storage_.coords_max._M_elems[0] = local_80;
  local_48.storage_.coords_max._M_elems[1] = dStack_78;
  local_48.storage_.coords_min._M_elems[0] = local_90;
  local_48.storage_.coords_min._M_elems[1] = dStack_88;
  local_60 = space.space_;
  local_58 = (undefined1 *)&local_d8;
  pnVar4 = build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::space_map<std::array<double,2ul>>>,pico_tree::max_leaf_size_t,pico_tree::sliding_midpoint_max_side_t,pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,double>,2ul>>
           ::create_node<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                     ((build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::space_map<std::array<double,2ul>>>,pico_tree::max_leaf_size_t,pico_tree::sliding_midpoint_max_side_t,pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,double>,2ul>>
                       *)&local_70,0,
                      (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish,&local_48);
  (__return_storage_ptr__->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (__return_storage_ptr__->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  (__return_storage_ptr__->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (__return_storage_ptr__->root_box).storage_.coords_min._M_elems[0] = local_90;
  (__return_storage_ptr__->root_box).storage_.coords_min._M_elems[1] = dStack_88;
  (__return_storage_ptr__->root_box).storage_.coords_max._M_elems[0] = local_80;
  (__return_storage_ptr__->root_box).storage_.coords_max._M_elems[1] = dStack_78;
  (__return_storage_ptr__->allocator).resource_._vptr_list_pool_resource =
       (_func_int **)&PTR__list_pool_resource_00106d98;
  (__return_storage_ptr__->allocator).resource_.head_ = local_a8;
  (__return_storage_ptr__->allocator).object_index_ = local_a0;
  (__return_storage_ptr__->allocator).chunk_ = pcStack_98;
  __return_storage_ptr__->root_node = pnVar4;
  return __return_storage_ptr__;
}

Assistant:

kd_tree_data_type operator()(
      SpaceWrapper_ space,
      splitter_stop_condition_t<Stop_> const& stop_condition,
      splitter_start_bounds_t<Bounds_> const& start_bounds,
      splitter_rule_t<Rule_> const&) {
    static_assert(
        std::is_same_v<scalar_type, typename SpaceWrapper_::scalar_type>);
    static_assert(Dim_ == SpaceWrapper_::dim);
    assert(space.size() > 0);

    using build_kd_tree_impl_type =
        build_kd_tree_impl<SpaceWrapper_, Stop_, Rule_, kd_tree_data_type>;
    using node_allocator_type = typename kd_tree_data_type::node_allocator_type;

    std::vector<index_type> indices(space.size());
    std::iota(indices.begin(), indices.end(), 0);
    box_type root_box = box_from_bounds(space, start_bounds.derived());
    node_allocator_type allocator;
    node_type* root_node = build_kd_tree_impl_type{
        space, stop_condition.derived().value, indices, allocator}(root_box);

    return kd_tree_data_type{
        std::move(indices), root_box, std::move(allocator), root_node};
  }